

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Gia_Man_t * Jf_ManDeriveCnfMiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Jf_Par_t local_118;
  
  memset(&local_118.nProcNum,0,0xf8);
  local_118.nLutSize = 6;
  local_118.nCutNum = 8;
  local_118.nRounds = 1;
  local_118.nVerbLimit = 5;
  local_118.DelayTarget = -1;
  local_118.fAreaOnly = 1;
  local_118.fFuncDsd = 0;
  local_118.fGenCnf = 1;
  local_118.fCoarsen = 0;
  local_118.fCutMin = 0;
  local_118.nLutSizeMax = 8;
  local_118.nCutNumMax = 0x10;
  local_118.fOptEdge = local_118.nRounds;
  local_118.fAddOrCla = local_118.nRounds;
  local_118.fVerbose = fVerbose;
  pGVar1 = Jf_ManPerformMapping(p,&local_118);
  return pGVar1;
}

Assistant:

Gia_Man_t * Jf_ManDeriveCnfMiter( Gia_Man_t * p, int fVerbose )
{
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->fGenCnf = 1;
    pPars->fCnfObjIds = 0;
    pPars->fAddOrCla = 1;
    pPars->fVerbose = fVerbose;
    return Jf_ManPerformMapping( p, pPars );
}